

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporalPhaseDecodingSynapse.cpp
# Opt level: O2

void __thiscall TemporalPhaseDecodingSynapse::update(TemporalPhaseDecodingSynapse *this)

{
  VectorXd *this_00;
  Event *pEVar1;
  Population *pPVar2;
  Scalar *pSVar3;
  int j;
  long index;
  int i;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Scalar local_38;
  
  this_00 = &this->spikeTimes;
  for (uVar4 = 0; (long)uVar4 < (long)this->inputSize; uVar4 = uVar4 + 1) {
    dVar6 = this->currentWindow;
    dVar7 = this->param->window_length_s;
    dVar5 = Clock::getCurrentTime(this->clock);
    if (dVar6 + dVar7 <= dVar5) {
      local_38 = -1.0;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,&local_38);
      this->currentWindow = this->param->window_length_s + this->currentWindow;
    }
    for (index = 0;
        index < (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows; index = index + 1) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          index);
      if ((*pSVar3 <= 0.0 && *pSVar3 != 0.0) &&
         (pEVar1 = (((this->super_Synapse).from_population)->output).
                   super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4], pEVar1->type == Spike)) {
        dVar7 = (double)this->param->som_frequency;
        dVar6 = round((((pEVar1->eventTime - this->currentWindow) - this->phaseOffset) /
                      this->param->window_length_s) * dVar7);
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            index);
        *pSVar3 = dVar6 / dVar7;
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            index);
        dVar6 = *pSVar3;
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            index);
        *pSVar3 = (dVar6 + -0.1) * 1.25;
        pEVar1 = (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar4];
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            index);
        pEVar1[1]._vptr_Event = (_func_int **)*pSVar3;
      }
      pPVar2 = (this->super_Synapse).to_population;
      (*pPVar2->_vptr_Population[5])
                (pPVar2,uVar4 & 0xffffffff,
                 (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar4]);
    }
    Logging::logValue(this->logger,(long)this,(int)uVar4,3,
                      (double)(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar4][1]._vptr_Event);
  }
  return;
}

Assistant:

void TemporalPhaseDecodingSynapse::update() {
    for(int i = 0; i < inputSize; i++) {
        if(currentWindow + param->window_length_s <= clock->getCurrentTime()) {
            spikeTimes.setConstant(-1);
            currentWindow += param->window_length_s;
        }
        for(int j = 0; j < spikeTimes.size(); j++) {
            if(spikeTimes(j) < 0 && from_population->output[i]->type == EventType::Spike) {
                
                double s0 = from_population->output[i]->eventTime - currentWindow - phaseOffset;
                s0 = round(s0/param->window_length_s*param->som_frequency);
                spikeTimes(j) = s0 * 1 / (param->som_frequency);
                spikeTimes(j) = (spikeTimes(j) - 0.1) * 1.25;

                static_cast<ValueEvent*>(output[i])->setValue(spikeTimes(j));
            } 
            to_population->setInput(i, output[i]);
        }
        logger->logValue((long)this, i, EventType::Value, static_cast<ValueEvent*>(output[i])->value);
    }
}